

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

optional<std::__cxx11::string> * __thiscall
nonstd::optional_lite::optional<std::__cxx11::string>::value_or<char_const(&)[2]>
          (optional<std::__cxx11::string> *this,char (*v) [2])

{
  value_type *pvVar1;
  char *in_RDX;
  bool local_75;
  allocator local_61;
  string local_60 [32];
  string local_40 [32];
  char *local_20;
  char (*v_local) [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_20 = in_RDX;
  v_local = v;
  this_local = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this;
  local_75 = optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)v);
  if (local_75) {
    pvVar1 = detail::
             storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(v + 4));
    std::__cxx11::string::string(local_40,(string *)pvVar1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,local_20,&local_61);
    std::__cxx11::string::string(local_40,local_60);
  }
  local_75 = !local_75;
  std::__cxx11::string::string((string *)this,local_40);
  std::__cxx11::string::~string(local_40);
  if (local_75) {
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  return this;
}

Assistant:

optional_constexpr14 value_type value_or( U && v ) optional_refref_qual
    {
#if optional_COMPILER_CLANG_VERSION
        return has_value() ? /*std::move*/( contained.value() ) : static_cast<T>(std::forward<U>( v ) );
#else
        return has_value() ? std::move( contained.value() ) : static_cast<T>(std::forward<U>( v ) );
#endif
    }